

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hack.c
# Opt level: O1

boolean check_capacity(char *str)

{
  int iVar1;
  boolean bVar2;
  char *line;
  
  iVar1 = inv_weight();
  if (iVar1 < 1) {
    bVar2 = '\0';
  }
  else if ((wc < 2) || (bVar2 = '\0', 2 < (uint)(iVar1 * 2) / (uint)wc)) {
    line = "You can\'t do that while carrying so much stuff.";
    if (str != (char *)0x0) {
      line = str;
    }
    pline(line);
    bVar2 = '\x01';
  }
  return bVar2;
}

Assistant:

boolean check_capacity(const char *str)
{
    if (near_capacity() >= EXT_ENCUMBER) {
	if (str)
	    pline(str);
	else
	    pline("You can't do that while carrying so much stuff.");
	return 1;
    }
    return 0;
}